

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int sort_source(void *a,void *b)

{
  char *__nptr;
  char *__nptr_00;
  ulong uVar1;
  ulong uVar2;
  unsigned_long lb;
  unsigned_long la;
  char *cb;
  char *ca;
  void *b_local;
  void *a_local;
  
  __nptr = (char *)bc_trie_lookup((bc_trie_t *)a,"c");
  __nptr_00 = (char *)bc_trie_lookup((bc_trie_t *)b,"c");
  if ((__nptr == (char *)0x0) || (__nptr_00 == (char *)0x0)) {
    a_local._4_4_ = 0;
  }
  else {
    uVar1 = strtoul(__nptr,(char **)0x0,10);
    uVar2 = strtoul(__nptr_00,(char **)0x0,10);
    a_local._4_4_ = (int)uVar2 - (int)uVar1;
  }
  return a_local._4_4_;
}

Assistant:

static int
sort_source(const void *a, const void *b)
{
    const char *ca = bc_trie_lookup((bc_trie_t*) a, "c");
    const char *cb = bc_trie_lookup((bc_trie_t*) b, "c");

    if (ca == NULL || cb == NULL) {
        return 0;  // wat
    }

    unsigned long la = strtoul(ca, NULL, 10);
    unsigned long lb = strtoul(cb, NULL, 10);

    return (int) (lb - la);
}